

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext *ctx)

{
  FunctionData *function;
  ScopeData *pSVar1;
  ArgumentData *pAVar2;
  long lVar3;
  VariableHandle *pVVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  ExpressionContext *this;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Function prototypes");
  this = ctx->ctx;
  if ((this->functions).count != 0) {
    uVar10 = 0;
    do {
      function = (this->functions).data[uVar10];
      bVar5 = ExpressionContext::IsGenericFunction(this,function);
      if ((!bVar5) && (function->implementation == (FunctionData *)0x0)) {
        pSVar1 = function->scope;
        if ((((pSVar1 == ctx->ctx->globalScope) ||
             ((pSVar1->ownerNamespace != (NamespaceData *)0x0 ||
              (pSVar1->ownerType != (TypeBase *)0x0)))) && (*(function->name->name).begin != '$'))
           && (function->isHidden == false)) {
          bVar5 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
          bVar6 = 0;
        }
        else {
          bVar6 = 1;
          bVar5 = false;
        }
        if (bVar6 == 0) {
          pcVar8 = "template<int I> ";
        }
        else {
          if (function->importModule != (ModuleData *)0x0) goto LAB_001485a1;
          bVar5 = (bool)(bVar5 | bVar6);
          pcVar8 = "template<int I> ";
          if (bVar6 != 0) {
            pcVar8 = "static ";
          }
        }
        if (bVar5 != false) {
          Print(ctx,pcVar8);
        }
        TranslateTypeName(ctx,function->type->returnType);
        Print(ctx," ");
        TranslateFunctionName(ctx,function);
        Print(ctx,"(");
        if (function->importModule == (ModuleData *)0x0) {
          for (pVVar4 = (function->argumentVariables).head; pVVar4 != (VariableHandle *)0x0;
              pVVar4 = pVVar4->next) {
            TranslateTypeName(ctx,pVVar4->variable->type);
            Print(ctx," ");
            TranslateVariableName(ctx,pVVar4->variable);
            Print(ctx,", ");
          }
          TranslateTypeName(ctx,function->contextArgument->type);
          Print(ctx," ");
          TranslateVariableName(ctx,function->contextArgument);
        }
        else {
          if ((function->arguments).count != 0) {
            lVar11 = 0x10;
            uVar9 = 0;
            do {
              pAVar2 = (function->arguments).data;
              TranslateTypeName(ctx,*(TypeBase **)(&pAVar2->isExplicit + lVar11));
              Print(ctx," ");
              local_40.begin = "this";
              local_40.end = "";
              bVar5 = InplaceStr::operator==
                                ((InplaceStr *)(*(long *)((long)&pAVar2->source + lVar11) + 0x40),
                                 &local_40);
              if (bVar5) {
                Print(ctx,"__context");
              }
              else {
                lVar3 = *(long *)((long)&pAVar2->source + lVar11);
                pcVar8 = *(char **)(lVar3 + 0x40);
                if (*pcVar8 == '$') {
                  if (*(char **)(lVar3 + 0x48) < pcVar8 + 1) {
                    __assert_fail("strEnd >= strBegin",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                                  ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
                  }
                  uVar7 = (int)*(char **)(lVar3 + 0x48) - (int)(pcVar8 + 1);
                  pcVar8 = "__%.*s";
                }
                else {
                  uVar7 = *(int *)(lVar3 + 0x48) - (int)pcVar8;
                  pcVar8 = "%.*s";
                }
                Print(ctx,pcVar8,(ulong)uVar7);
              }
              Print(ctx,", ");
              uVar9 = uVar9 + 1;
              lVar11 = lVar11 + 0x30;
            } while (uVar9 < (function->arguments).count);
          }
          TranslateTypeName(ctx,function->contextType);
          Print(ctx," __context");
        }
        Print(ctx,");");
        OutputContext::Print(ctx->output,"\n",1);
      }
LAB_001485a1:
      uVar10 = uVar10 + 1;
      this = ctx->ctx;
    } while (uVar10 < (this->functions).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleFunctionPrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Function prototypes");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		if(function->implementation)
			continue;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic && function->importModule)
			continue;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		if(function->importModule)
		{
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &argument = function->arguments[i];

				TranslateTypeName(ctx, argument.type);
				Print(ctx, " ");

				if(argument.name->name == InplaceStr("this"))
				{
					Print(ctx, "__context");
				}
				else if(*argument.name->name.begin == '$')
				{
					InplaceStr name = InplaceStr(argument.name->name.begin + 1, argument.name->name.end);

					Print(ctx, "__%.*s", FMT_ISTR(name));
				}
				else
				{
					Print(ctx, "%.*s", FMT_ISTR(argument.name->name));
				}

				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextType);
			Print(ctx, " __context");
		}
		else
		{
			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				TranslateTypeName(ctx, curr->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, function->contextArgument->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, function->contextArgument);
		}

		Print(ctx, ");");
		PrintLine(ctx);
	}

	PrintLine(ctx);
}